

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

int __thiscall Fl_Preferences::Node::remove(Node *this,char *__filename)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *extraout_RAX;
  Node *local_20;
  Node *np;
  Node *nd;
  Node *this_local;
  
  np = (Node *)0x0;
  pNVar1 = parent(this);
  if (pNVar1 != (Node *)0x0) {
    pNVar1 = parent(this);
    np = pNVar1->child_;
    local_20 = (Node *)0x0;
    for (; np != (Node *)0x0; np = np->next_) {
      if (np == this) {
        if (local_20 == (Node *)0x0) {
          pNVar1 = np->next_;
          pNVar2 = parent(this);
          pNVar2->child_ = pNVar1;
        }
        else {
          local_20->next_ = np->next_;
        }
        break;
      }
      local_20 = np;
    }
    pNVar1 = parent(this);
    pNVar1->field_0x30 = pNVar1->field_0x30 & 0xfe | 1;
    pNVar1 = parent(this);
    updateIndex(pNVar1);
  }
  if (this != (Node *)0x0) {
    ~Node(this);
    operator_delete(this,0x48);
    this = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),np != (Node *)0x0);
}

Assistant:

char Fl_Preferences::Node::remove() {
  Node *nd = 0, *np;
  if ( parent() ) {
    nd = parent()->child_; np = 0L;
    for ( ; nd; np = nd, nd = nd->next_ ) {
      if ( nd == this ) {
	if ( np )
	  np->next_ = nd->next_;
	else
	  parent()->child_ = nd->next_;
	break;
      }
    }
    parent()->dirty_ = 1;
    parent()->updateIndex();
  }
  delete this;
  return ( nd != 0 );
}